

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O2

ModulePtr __thiscall
chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>
          (standard_library *this,string *type,ModulePtr *m)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ModulePtr MVar3;
  allocator local_3d1;
  Type_Info local_3d0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_3b8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_3a8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_398;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_388;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_378;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_368;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_358;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_348;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_338;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_328;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_318;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_308;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_2f8;
  __shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2> local_2e8;
  __shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2> local_2d8;
  __shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2> local_2b8;
  __shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2> local_2a8;
  __shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2> local_298;
  __shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2> local_288;
  __shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  standard_library local_c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  standard_library local_b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  standard_library local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  standard_library local_98 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  standard_library local_88 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  bootstrap local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  operators local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  operators local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string((string *)&local_48,(string *)type);
  local_3d0.m_type_info = (type_info *)&std::__cxx11::string::typeinfo;
  local_3d0.m_bare_type_info = (type_info *)&std::__cxx11::string::typeinfo;
  local_3d0.m_flags = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)peVar1,&local_3d0,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_278,&m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>);
  operators::addition<std::__cxx11::string>(local_58,(ModulePtr *)&local_278);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_278._M_refcount);
  std::__shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_288,&m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>);
  operators::assign_sum<std::__cxx11::string>(local_68,(ModulePtr *)&local_288);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_288._M_refcount);
  std::__shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_298,&m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>);
  opers_comparison<std::__cxx11::string>(local_78,(ModulePtr *)&local_298);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_298._M_refcount);
  std::__shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2a8,&m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>);
  random_access_container_type<std::__cxx11::string>(local_88,type,(ModulePtr *)&local_2a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2a8._M_refcount);
  std::__shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2b8,&m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>);
  sequence_type<std::__cxx11::string>(local_98,type,(ModulePtr *)&local_2b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2b8._M_refcount);
  std::__shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2c8,&m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>);
  default_constructible_type<std::__cxx11::string>(local_a8,type,(ModulePtr *)&local_2c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2c8._M_refcount);
  std::__shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2d8,&m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>);
  assignable_type<std::__cxx11::string>(local_b8,type,(ModulePtr *)&local_2d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2d8._M_refcount);
  std::__shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2e8,&m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>);
  input_range_type<std::__cxx11::string>(local_c8,type,(ModulePtr *)&local_2e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2e8._M_refcount);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  fun<void,std::__cxx11::string,char>
            ((offset_in_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_to_subr)
             &local_2f8);
  string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)
  ::{lambda()#1}::operator()[abi_cxx11_(&local_e8,&local_3d0);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_2f8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2f8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<unsigned_long(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_1_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_1_const&>
            ((anon_class_1_0_00000001_for_m_f *)&local_308);
  std::__cxx11::string::string((string *)&local_108,"find",&local_3d1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_308,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_308.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<unsigned_long(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_2_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_2_const&>
            ((anon_class_1_0_00000001_for_m_f *)&local_318);
  std::__cxx11::string::string((string *)&local_128,"rfind",&local_3d1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_318,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_318.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<unsigned_long(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_3_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_3_const&>
            ((anon_class_1_0_00000001_for_m_f *)&local_328);
  std::__cxx11::string::string((string *)&local_148,"find_first_of",&local_3d1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_328,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_328.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<unsigned_long(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_4_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_4_const&>
            ((anon_class_1_0_00000001_for_m_f *)&local_338);
  std::__cxx11::string::string((string *)&local_168,"find_last_of",&local_3d1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_338,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_338.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<unsigned_long(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_5_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_5_const&>
            ((anon_class_1_0_00000001_for_m_f *)&local_348);
  std::__cxx11::string::string((string *)&local_188,"find_last_not_of",&local_3d1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_348,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_348.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<unsigned_long(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_6_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,std::__cxx11::string_const&,unsigned_long)_6_const&>
            ((anon_class_1_0_00000001_for_m_f *)&local_358);
  std::__cxx11::string::string((string *)&local_1a8,"find_first_not_of",&local_3d1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_358,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_358.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<void(std::__cxx11::string*),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string*)_1_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string*)_1_const&>
            ((anon_class_1_0_00000001_for_m_f *)&local_368);
  std::__cxx11::string::string((string *)&local_1c8,"clear",&local_3d1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_368,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_368.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<bool(std::__cxx11::string_const*),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*)_1_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*)_1_const&>
            ((anon_class_1_0_00000001_for_m_f *)&local_378);
  std::__cxx11::string::string((string *)&local_1e8,"empty",&local_3d1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_378,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_378.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<unsigned_long(std::__cxx11::string_const*),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*)_2_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*)_2_const&>
            ((anon_class_1_0_00000001_for_m_f *)&local_388);
  std::__cxx11::string::string((string *)&local_208,"size",&local_3d1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_388,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_388.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<char_const*(std::__cxx11::string_const*),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*)_3_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*)_3_const&>
            ((anon_class_1_0_00000001_for_m_f *)&local_398);
  std::__cxx11::string::string((string *)&local_228,"c_str",&local_3d1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_398,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_398.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<char_const*(std::__cxx11::string_const*),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*)_4_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*)_4_const&>
            ((anon_class_1_0_00000001_for_m_f *)&local_3a8);
  std::__cxx11::string::string((string *)&local_248,"data",&local_3d1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_3a8,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_3a8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::__cxx11::string(std::__cxx11::string_const*,unsigned_long,unsigned_long),chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,unsigned_long,unsigned_long)_1_>,chaiscript::bootstrap::standard_library::string_type<std::__cxx11::string>(std::__cxx11::string_const&,std::shared_ptr<chaiscript::Module>)::_lambda(std::__cxx11::string_const*,unsigned_long,unsigned_long)_1_const&>
            ((anon_class_1_0_00000001_for_m_f *)&local_3b8);
  std::__cxx11::string::string((string *)&local_268,"substr",&local_3d1);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_3b8,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_3b8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)this = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var2;
  (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  MVar3.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar3.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModulePtr)MVar3.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModulePtr string_type(const std::string &type, ModulePtr m = std::make_shared<Module>())
        {
          m->add(user_type<String>(), type);
          operators::addition<String>(m);
          operators::assign_sum<String>(m);
          opers_comparison<String>(m);
          random_access_container_type<String>(type, m);
          sequence_type<String>(type, m);
          default_constructible_type<String>(type, m);
          // container_type<String>(type, m);
          assignable_type<String>(type, m);
          input_range_type<String>(type, m);

          //Special case: add push_back to string (which doesn't support other back_insertion operations
          m->add(fun(&String::push_back), 
              []()->std::string{
                if (typeid(typename String::value_type) == typeid(Boxed_Value)) {
                  return "push_back_ref";
                } else {
                  return "push_back";
                }
              }());


          m->add(fun([](const String *s, const String &f, size_t pos) { return s->find(f, pos); } ), "find");
          m->add(fun([](const String *s, const String &f, size_t pos) { return s->rfind(f, pos); } ), "rfind");
          m->add(fun([](const String *s, const String &f, size_t pos) { return s->find_first_of(f, pos); } ), "find_first_of");
          m->add(fun([](const String *s, const String &f, size_t pos) { return s->find_last_of(f, pos); } ), "find_last_of");
          m->add(fun([](const String *s, const String &f, size_t pos) { return s->find_last_not_of(f, pos); } ), "find_last_not_of");
          m->add(fun([](const String *s, const String &f, size_t pos) { return s->find_first_not_of(f, pos); } ), "find_first_not_of");

          m->add(fun([](String *s) { s->clear(); } ), "clear");
          m->add(fun([](const String *s) { return s->empty(); } ), "empty");
          m->add(fun([](const String *s) { return s->size(); } ), "size");

          m->add(fun([](const String *s) { return s->c_str(); } ), "c_str");
          m->add(fun([](const String *s) { return s->data(); } ), "data");
          m->add(fun([](const String *s, size_t pos, size_t len) { return s->substr(pos, len); } ), "substr");

          return m;
        }